

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O0

void __thiscall correctness_sub_long_Test::TestBody(correctness_sub_long_Test *this)

{
  bool bVar1;
  AssertionResult gtest_ar;
  big_integer c;
  big_integer *in_stack_00000120;
  big_integer b;
  big_integer a;
  big_integer *in_stack_fffffffffffffe10;
  undefined7 in_stack_fffffffffffffe18;
  undefined1 in_stack_fffffffffffffe1f;
  big_integer *b_00;
  big_integer *a_00;
  int line;
  big_integer *this_00;
  Type in_stack_fffffffffffffe3c;
  allocator<char> *in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  Message *in_stack_fffffffffffffe88;
  AssertHelper *in_stack_fffffffffffffe90;
  AssertionResult local_148;
  undefined1 local_131 [96];
  undefined1 local_d1 [112];
  undefined1 local_61 [97];
  
  this_00 = (big_integer *)local_61;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  big_integer::big_integer
            (in_stack_00000120,
             (string *)
             c.number.data.ptr.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi);
  std::__cxx11::string::~string((string *)(local_61 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_61);
  a_00 = (big_integer *)local_d1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  big_integer::big_integer
            (in_stack_00000120,
             (string *)
             c.number.data.ptr.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi);
  std::__cxx11::string::~string((string *)(local_d1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_d1);
  b_00 = (big_integer *)local_131;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  big_integer::big_integer
            (in_stack_00000120,
             (string *)
             c.number.data.ptr.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi);
  std::__cxx11::string::~string((string *)(local_131 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_131);
  big_integer::big_integer(this_00,a_00);
  ::operator-(a_00,b_00);
  testing::internal::EqHelper<false>::Compare<big_integer,big_integer>
            (&a_00->sign,&b_00->sign,
             (big_integer *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18),
             in_stack_fffffffffffffe10);
  line = (int)((ulong)a_00 >> 0x20);
  big_integer::~big_integer(in_stack_fffffffffffffe10);
  big_integer::~big_integer(in_stack_fffffffffffffe10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_148);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe40);
    in_stack_fffffffffffffe10 =
         (big_integer *)testing::AssertionResult::failure_message((AssertionResult *)0x11fc72);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,&this_00->sign,
               line,&b_00->sign);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe10);
    testing::Message::~Message((Message *)0x11fcc0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11fd0f);
  big_integer::~big_integer(in_stack_fffffffffffffe10);
  big_integer::~big_integer(in_stack_fffffffffffffe10);
  big_integer::~big_integer(in_stack_fffffffffffffe10);
  return;
}

Assistant:

TEST(correctness, sub_long)
{
    big_integer a("10000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000");
    big_integer b(                                                     "100000000000000000000000000000000000000");
    big_integer c( "9999999999999999999999999999999999999999999999999999900000000000000000000000000000000000000");

    EXPECT_EQ(a - b, c);
}